

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uncompressed.cpp
# Opt level: O3

CompressionFunction *
duckdb::UncompressedFun::GetFunction(CompressionFunction *__return_storage_ptr__,PhysicalType type)

{
  InternalException *this;
  uint uVar1;
  undefined7 in_register_00000031;
  string local_40;
  
  uVar1 = (uint)CONCAT71(in_register_00000031,type);
  if ((int)uVar1 < 200) {
    if ((0x17 < uVar1) || ((0xa01bfeU >> (uVar1 & 0x1f) & 1) == 0)) {
LAB_0056f375:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Unsupported type for Uncompressed","");
      InternalException::InternalException(this,&local_40);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else if (1 < uVar1 - 0xcb) {
    if (uVar1 == 200) {
      StringUncompressed::GetFunction(VARCHAR);
      return __return_storage_ptr__;
    }
    if (uVar1 == 0xce) {
      __return_storage_ptr__->type = COMPRESSION_UNCOMPRESSED;
      __return_storage_ptr__->data_type = BIT;
      __return_storage_ptr__->init_analyze = ValidityInitAnalyze;
      __return_storage_ptr__->analyze = ValidityAnalyze;
      __return_storage_ptr__->final_analyze = ValidityFinalAnalyze;
      __return_storage_ptr__->init_compression = UncompressedFunctions::InitCompression;
      __return_storage_ptr__->compress = UncompressedFunctions::Compress;
      __return_storage_ptr__->compress_finalize = UncompressedFunctions::FinalizeCompress;
      __return_storage_ptr__->init_prefetch = (compression_init_prefetch_t)0x0;
      __return_storage_ptr__->init_scan = ValidityInitScan;
      __return_storage_ptr__->scan_vector = ValidityScan;
      __return_storage_ptr__->scan_partial = ValidityScanPartial;
      __return_storage_ptr__->select = (compression_select_t)0x0;
      __return_storage_ptr__->filter = (compression_filter_t)0x0;
      __return_storage_ptr__->fetch_row = ValidityFetchRow;
      __return_storage_ptr__->skip = UncompressedFunctions::EmptySkip;
      __return_storage_ptr__->init_segment = ValidityInitSegment;
      __return_storage_ptr__->init_append = ValidityInitAppend;
      __return_storage_ptr__->append = ValidityAppend;
      __return_storage_ptr__->finalize_append = ValidityFinalizeAppend;
      __return_storage_ptr__->revert_append = ValidityRevertAppend;
      __return_storage_ptr__->cleanup_state = (compression_cleanup_state_t)0x0;
      __return_storage_ptr__->get_segment_info = (compression_get_segment_info_t)0x0;
      __return_storage_ptr__->serialize_state = (compression_serialize_state_t)0x0;
      __return_storage_ptr__->deserialize_state = (compression_deserialize_state_t)0x0;
      __return_storage_ptr__->validity = REQUIRES_VALIDITY;
      return __return_storage_ptr__;
    }
    goto LAB_0056f375;
  }
  FixedSizeUncompressed::GetFunction(__return_storage_ptr__,type);
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction UncompressedFun::GetFunction(PhysicalType type) {
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::INT128:
	case PhysicalType::UINT8:
	case PhysicalType::UINT16:
	case PhysicalType::UINT32:
	case PhysicalType::UINT64:
	case PhysicalType::UINT128:
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
	case PhysicalType::LIST:
	case PhysicalType::INTERVAL:
		return FixedSizeUncompressed::GetFunction(type);
	case PhysicalType::BIT:
		return ValidityUncompressed::GetFunction(type);
	case PhysicalType::VARCHAR:
		return StringUncompressed::GetFunction(type);
	default:
		throw InternalException("Unsupported type for Uncompressed");
	}
}